

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,XrSystemProperties *value
                         )

{
  NextChainResult NVar1;
  size_t sVar2;
  XrResult XVar3;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  string error_message;
  string local_100;
  string *local_e0;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_98;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_80;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_68;
  string local_50;
  
  XVar3 = XR_SUCCESS;
  local_e0 = command_name;
  if (value->type != XR_TYPE_SYSTEM_PROPERTIES) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrSystemProperties",value->type,
               "VUID-XrSystemProperties-type-type",XR_TYPE_SYSTEM_PROPERTIES,
               "XR_TYPE_SYSTEM_PROPERTIES");
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  if (check_pnext) {
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    error_message._M_dataplus._M_p._0_4_ = 0x3b9fa818;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
    _M_realloc_insert<XrStructureType>
              (&valid_ext_structs,(iterator)0x0,(XrStructureType *)&error_message);
    error_message._M_dataplus._M_p._0_4_ = 0x3ba0a9ec;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish = XR_TYPE_SYSTEM_BODY_TRACKING_PROPERTIES_BD;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3b9bf2e4;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish = XR_TYPE_SYSTEM_BODY_TRACKING_PROPERTIES_FB;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3b9fac00;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish = XR_TYPE_SYSTEM_BODY_TRACKING_PROPERTIES_HTC;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3ba38096;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish =
           XR_TYPE_SYSTEM_COLOCATION_DISCOVERY_PROPERTIES_META;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3b9c6fe0;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish = XR_TYPE_SYSTEM_COLOR_SPACE_PROPERTIES_FB;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3b9f3abf;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish = XR_TYPE_SYSTEM_ENVIRONMENT_DEPTH_PROPERTIES_META;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3b9b3f30;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish =
           XR_TYPE_SYSTEM_EYE_GAZE_INTERACTION_PROPERTIES_EXT;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3b9ddf14;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish = XR_TYPE_SYSTEM_EYE_TRACKING_PROPERTIES_FB;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3b9f2b25;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish = XR_TYPE_SYSTEM_FACE_TRACKING_PROPERTIES2_FB;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3b9ddb2c;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish = XR_TYPE_SYSTEM_FACE_TRACKING_PROPERTIES_FB;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3ba224d4;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish = XR_TYPE_SYSTEM_FACIAL_EXPRESSION_PROPERTIES_ML;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3b9c6040;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish = XR_TYPE_SYSTEM_FACIAL_TRACKING_PROPERTIES_HTC;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3ba082d8;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish =
           XR_TYPE_SYSTEM_FORCE_FEEDBACK_CURL_PROPERTIES_MNDX;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3b9ca2aa;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish =
           XR_TYPE_SYSTEM_FOVEATED_RENDERING_PROPERTIES_VARJO;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3b9dd742;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish =
           XR_TYPE_SYSTEM_FOVEATION_EYE_TRACKED_PROPERTIES_META;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3b9b9520;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish = XR_TYPE_SYSTEM_HAND_TRACKING_MESH_PROPERTIES_MSFT
      ;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3b9b9138;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish = XR_TYPE_SYSTEM_HAND_TRACKING_PROPERTIES_EXT;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3b9e8708;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish = XR_TYPE_SYSTEM_HEADSET_ID_PROPERTIES_META;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3b9c8f22;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish = XR_TYPE_SYSTEM_KEYBOARD_TRACKING_PROPERTIES_FB;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3b9cae60;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish = XR_TYPE_SYSTEM_MARKER_TRACKING_PROPERTIES_VARJO;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3b9ce510;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish = XR_TYPE_SYSTEM_MARKER_UNDERSTANDING_PROPERTIES_ML
      ;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3b9ed910;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish =
           XR_TYPE_SYSTEM_PASSTHROUGH_COLOR_LUT_PROPERTIES_META;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3b9c96f6;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish = XR_TYPE_SYSTEM_PASSTHROUGH_PROPERTIES2_FB;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3b9c96f0;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish = XR_TYPE_SYSTEM_PASSTHROUGH_PROPERTIES_FB;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3ba155cf;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish = XR_TYPE_SYSTEM_PLANE_DETECTION_PROPERTIES_EXT;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3b9c9adc;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish = XR_TYPE_SYSTEM_RENDER_MODEL_PROPERTIES_FB;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3b9d65f9;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish = XR_TYPE_SYSTEM_SPACE_WARP_PROPERTIES_FB;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3ba0bd70;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish = XR_TYPE_SYSTEM_SPATIAL_ANCHOR_PROPERTIES_BD;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3ba0c158;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish =
           XR_TYPE_SYSTEM_SPATIAL_ANCHOR_SHARING_PROPERTIES_BD;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3ba384c4;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish =
           XR_TYPE_SYSTEM_SPATIAL_ENTITY_GROUP_SHARING_PROPERTIES_META;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3b9c836c;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish = XR_TYPE_SYSTEM_SPATIAL_ENTITY_PROPERTIES_FB;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3b9f36d0;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish =
           XR_TYPE_SYSTEM_SPATIAL_ENTITY_SHARING_PROPERTIES_META;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3ba0c928;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish = XR_TYPE_SYSTEM_SPATIAL_MESH_PROPERTIES_BD;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3ba0c540;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish = XR_TYPE_SYSTEM_SPATIAL_SCENE_PROPERTIES_BD;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3ba0b988;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish = XR_TYPE_SYSTEM_SPATIAL_SENSING_PROPERTIES_BD;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3ba1f5f1;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish = XR_TYPE_SYSTEM_USER_PRESENCE_PROPERTIES_EXT;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    error_message._M_dataplus._M_p._0_4_ = 0x3b9e2179;
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<XrStructureType,_std::allocator<XrStructureType>_>::
      _M_realloc_insert<XrStructureType>
                (&valid_ext_structs,
                 (iterator)
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_finish,(XrStructureType *)&error_message);
    }
    else {
      *valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
       _M_impl.super__Vector_impl_data._M_finish = XR_TYPE_SYSTEM_VIRTUAL_KEYBOARD_PROPERTIES_META;
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    NVar1 = ValidateNextChain(instance_info,local_e0,objects_info,value->next,&valid_ext_structs,
                              &encountered_structs,&duplicate_ext_structs);
    if (NVar1 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&error_message,
                 "Multiple structures of the same type(s) in \"next\" chain for ","");
      std::__cxx11::string::append((char *)&error_message);
      StructTypesToString_abi_cxx11_(&local_100,instance_info,&duplicate_ext_structs);
      std::__cxx11::string::_M_append((char *)&error_message,(ulong)local_100._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_100,"VUID-XrSystemProperties-next-unique","");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_80,objects_info);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,
                 "Multiple structures of the same type(s) in \"next\" chain for XrSystemProperties struct"
                 ,"");
      CoreValidLogMessage(instance_info,&local_100,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_e0,
                          &local_80,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (local_80.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80.
                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_80.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_80.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)error_message._M_dataplus._M_p != &error_message.field_2) {
        operator_delete(error_message._M_dataplus._M_p,
                        error_message.field_2._M_allocated_capacity + 1);
      }
      XVar3 = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (NVar1 == NEXT_CHAIN_RESULT_ERROR) {
      error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&error_message,"VUID-XrSystemProperties-next-next","");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_68,objects_info);
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_100,
                 "Invalid structure(s) in \"next\" chain for XrSystemProperties struct \"next\"","")
      ;
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_e0,
                          &local_68,&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if (local_68.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.
                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)error_message._M_dataplus._M_p != &error_message.field_2) {
        operator_delete(error_message._M_dataplus._M_p,
                        error_message.field_2._M_allocated_capacity + 1);
      }
      XVar3 = XR_ERROR_VALIDATION_FAILURE;
    }
    if (encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(encountered_structs.
                      super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)encountered_structs.
                            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)encountered_structs.
                            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(duplicate_ext_structs.
                      super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)duplicate_ext_structs.
                            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)duplicate_ext_structs.
                            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(valid_ext_structs.
                      super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)valid_ext_structs.
                            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)valid_ext_structs.
                            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (check_members && XVar3 == XR_SUCCESS) {
    sVar2 = strlen(value->systemName);
    XVar3 = XR_SUCCESS;
    if (0x100 < sVar2) {
      error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&error_message,"VUID-XrSystemProperties-systemName-parameter","");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_98,objects_info);
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_100,
                 "Structure XrSystemProperties member systemName length is too long.","");
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_e0,
                          &local_98,&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if (local_98.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.
                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_98.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)error_message._M_dataplus._M_p != &error_message.field_2) {
        operator_delete(error_message._M_dataplus._M_p,
                        error_message.field_2._M_allocated_capacity + 1);
      }
      XVar3 = XR_ERROR_VALIDATION_FAILURE;
    }
  }
  return XVar3;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrSystemProperties* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_SYSTEM_PROPERTIES) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrSystemProperties",
                             value->type, "VUID-XrSystemProperties-type-type", XR_TYPE_SYSTEM_PROPERTIES, "XR_TYPE_SYSTEM_PROPERTIES");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_ANCHOR_PROPERTIES_HTC);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_BODY_TRACKING_PROPERTIES_BD);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_BODY_TRACKING_PROPERTIES_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_BODY_TRACKING_PROPERTIES_HTC);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_COLOCATION_DISCOVERY_PROPERTIES_META);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_COLOR_SPACE_PROPERTIES_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_ENVIRONMENT_DEPTH_PROPERTIES_META);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_EYE_GAZE_INTERACTION_PROPERTIES_EXT);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_EYE_TRACKING_PROPERTIES_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_FACE_TRACKING_PROPERTIES2_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_FACE_TRACKING_PROPERTIES_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_FACIAL_EXPRESSION_PROPERTIES_ML);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_FACIAL_TRACKING_PROPERTIES_HTC);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_FORCE_FEEDBACK_CURL_PROPERTIES_MNDX);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_FOVEATED_RENDERING_PROPERTIES_VARJO);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_FOVEATION_EYE_TRACKED_PROPERTIES_META);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_HAND_TRACKING_MESH_PROPERTIES_MSFT);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_HAND_TRACKING_PROPERTIES_EXT);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_HEADSET_ID_PROPERTIES_META);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_KEYBOARD_TRACKING_PROPERTIES_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_MARKER_TRACKING_PROPERTIES_VARJO);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_MARKER_UNDERSTANDING_PROPERTIES_ML);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_PASSTHROUGH_COLOR_LUT_PROPERTIES_META);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_PASSTHROUGH_PROPERTIES2_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_PASSTHROUGH_PROPERTIES_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_PLANE_DETECTION_PROPERTIES_EXT);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_RENDER_MODEL_PROPERTIES_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_SPACE_WARP_PROPERTIES_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_SPATIAL_ANCHOR_PROPERTIES_BD);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_SPATIAL_ANCHOR_SHARING_PROPERTIES_BD);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_SPATIAL_ENTITY_GROUP_SHARING_PROPERTIES_META);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_SPATIAL_ENTITY_PROPERTIES_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_SPATIAL_ENTITY_SHARING_PROPERTIES_META);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_SPATIAL_MESH_PROPERTIES_BD);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_SPATIAL_SCENE_PROPERTIES_BD);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_SPATIAL_SENSING_PROPERTIES_BD);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_USER_PRESENCE_PROPERTIES_EXT);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_VIRTUAL_KEYBOARD_PROPERTIES_META);
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrSystemProperties-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrSystemProperties struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrSystemProperties : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrSystemProperties-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrSystemProperties struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    if (XR_MAX_SYSTEM_NAME_SIZE < std::strlen(value->systemName)) {
        CoreValidLogMessage(instance_info, "VUID-XrSystemProperties-systemName-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrSystemProperties member systemName length is too long.");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Validate that the structure XrSystemTrackingProperties is valid
    xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                     check_members, true, &value->trackingProperties);
    if (XR_SUCCESS != xr_result) {
        CoreValidLogMessage(instance_info, "VUID-XrSystemProperties-trackingProperties-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrSystemProperties member trackingProperties is invalid");
        return xr_result;
    }
    // Everything checked out properly
    return xr_result;
}